

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cRGBA,cBGRA,bModulate>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  FSpecialColormap *pFVar4;
  EBlend EVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  BYTE *pBVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  
  pFVar4 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar5 = BLEND_NONE;
  }
  else {
    EVar5 = inf->blend;
  }
  switch(EVar5) {
  case BLEND_NONE:
    if (0 < count) {
      pBVar9 = pin + 3;
      lVar6 = 0;
      do {
        BVar1 = *pBVar9;
        if (BVar1 != '\0') {
          pout[lVar6 * 4 + 2] = (BYTE)(((uint)pout[lVar6 * 4 + 2] * (uint)pBVar9[-3]) / 0xff);
          pout[lVar6 * 4 + 1] = (BYTE)(((uint)pout[lVar6 * 4 + 1] * (uint)pBVar9[-2]) / 0xff);
          pout[lVar6 * 4] = (BYTE)(((uint)pout[lVar6 * 4] * (uint)pBVar9[-1]) / 0xff);
          pout[lVar6 * 4 + 3] = BVar1;
        }
        lVar6 = lVar6 + 1;
        pBVar9 = pBVar9 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pBVar9 = pin + 3;
      lVar6 = 0;
      do {
        BVar1 = *pBVar9;
        if (BVar1 != '\0') {
          uVar11 = (uint)pBVar9[-2] * 0x8f + (uint)pBVar9[-3] * 0x4d +
                   ((uint)pBVar9[-1] + (uint)pBVar9[-1] * 8) * 4 >> 0xc;
          pout[lVar6 * 4 + 2] =
               (BYTE)(((uint)pout[lVar6 * 4 + 2] * (uint)IcePalette[uVar11][0]) / 0xff);
          pout[lVar6 * 4 + 1] =
               (BYTE)(((uint)pout[lVar6 * 4 + 1] * (uint)IcePalette[uVar11][1]) / 0xff);
          pout[lVar6 * 4] = (BYTE)(((uint)pout[lVar6 * 4] * (uint)IcePalette[uVar11][2]) / 0xff);
          pout[lVar6 * 4 + 3] = BVar1;
        }
        lVar6 = lVar6 + 1;
        pBVar9 = pBVar9 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pBVar9 = pin + 3;
      lVar6 = 0;
      do {
        BVar1 = *pBVar9;
        if (BVar1 != '\0') {
          iVar10 = inf->blendcolor[3];
          bVar2 = pBVar9[-2];
          iVar7 = inf->blendcolor[1];
          bVar3 = pBVar9[-1];
          iVar8 = inf->blendcolor[2];
          pout[lVar6 * 4 + 2] =
               (BYTE)(((uint)pout[lVar6 * 4 + 2] *
                      ((uint)pBVar9[-3] * iVar10 + inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
          pout[lVar6 * 4 + 1] =
               (BYTE)(((uint)pout[lVar6 * 4 + 1] * ((uint)bVar2 * iVar10 + iVar7 >> 0x10 & 0xff)) /
                     0xff);
          pout[lVar6 * 4] =
               (BYTE)(((uint)pout[lVar6 * 4] * ((uint)bVar3 * iVar10 + iVar8 >> 0x10 & 0xff)) / 0xff
                     );
          pout[lVar6 * 4 + 3] = BVar1;
        }
        lVar6 = lVar6 + 1;
        pBVar9 = pBVar9 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pBVar9 = pin + 3;
      lVar6 = 0;
      do {
        BVar1 = *pBVar9;
        if (BVar1 != '\0') {
          bVar2 = pBVar9[-2];
          iVar10 = inf->blendcolor[1];
          bVar3 = pBVar9[-1];
          iVar7 = inf->blendcolor[2];
          pout[lVar6 * 4 + 2] =
               (BYTE)(((uint)pout[lVar6 * 4 + 2] *
                      ((uint)pBVar9[-3] * inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
          pout[lVar6 * 4 + 1] =
               (BYTE)(((uint)pout[lVar6 * 4 + 1] * ((uint)bVar2 * iVar10 >> 0x10 & 0xff)) / 0xff);
          pout[lVar6 * 4] =
               (BYTE)(((uint)pout[lVar6 * 4] * ((uint)bVar3 * iVar7 >> 0x10 & 0xff)) / 0xff);
          pout[lVar6 * 4 + 3] = BVar1;
        }
        lVar6 = lVar6 + 1;
        pBVar9 = pBVar9 + step;
      } while (count != (int)lVar6);
    }
    break;
  default:
    EVar5 = inf->blend;
    lVar6 = (long)EVar5;
    if (lVar6 < 0x21) {
      if ((BLEND_ICEMAP < EVar5) && (0 < count)) {
        iVar10 = 0x20 - EVar5;
        pBVar9 = pin + 3;
        lVar6 = 0;
        do {
          BVar1 = *pBVar9;
          if (BVar1 != '\0') {
            bVar2 = pBVar9[-1];
            iVar8 = ((uint)pBVar9[-2] * 0x8f + (uint)pBVar9[-3] * 0x4d +
                     ((uint)bVar2 + (uint)bVar2 * 8) * 4 >> 8) * (EVar5 + BLEND_MODULATE);
            iVar7 = (uint)pBVar9[-3] * iVar10 + iVar8;
            iVar15 = (uint)pBVar9[-2] * iVar10 + iVar8;
            iVar8 = (uint)bVar2 * iVar10 + iVar8;
            pout[lVar6 * 4 + 2] =
                 (BYTE)(((uint)pout[lVar6 * 4 + 2] *
                        ((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) - (iVar7 >> 0x1f) & 0xff)
                        ) / 0xff);
            pout[lVar6 * 4 + 1] =
                 (BYTE)(((uint)pout[lVar6 * 4 + 1] *
                        ((uint)((ulong)((long)iVar15 * 0x84210843) >> 0x24) - (iVar15 >> 0x1f) &
                        0xff)) / 0xff);
            pout[lVar6 * 4] =
                 (BYTE)(((uint)pout[lVar6 * 4] *
                        ((uint)((ulong)((long)iVar8 * 0x84210843) >> 0x24) - (iVar8 >> 0x1f) & 0xff)
                        ) / 0xff);
            pout[lVar6 * 4 + 3] = BVar1;
          }
          lVar6 = lVar6 + 1;
          pBVar9 = pBVar9 + step;
        } while (count != (int)lVar6);
      }
    }
    else if (0 < count) {
      pBVar9 = pin + 3;
      lVar12 = 0;
      do {
        BVar1 = *pBVar9;
        if (BVar1 != '\0') {
          uVar11 = (uint)pBVar9[-2] * 0x8f + (uint)pBVar9[-3] * 0x4d +
                   ((uint)pBVar9[-1] + (uint)pBVar9[-1] * 8) * 4;
          uVar13 = uVar11 >> 8;
          if (0xfe < uVar13) {
            uVar13 = 0xff;
          }
          uVar14 = (ulong)uVar13;
          if (uVar11 < 0x100) {
            uVar14 = 0;
          }
          bVar2 = *(byte *)((long)pFVar4 + uVar14 * 4 + lVar6 * 0x518 + -0xa700);
          bVar3 = *(byte *)((long)pFVar4 + uVar14 * 4 + lVar6 * 0x518 + -0xa6ff);
          pout[lVar12 * 4 + 2] =
               (BYTE)(((uint)pout[lVar12 * 4 + 2] *
                      (uint)*(byte *)((long)pFVar4 + uVar14 * 4 + lVar6 * 0x518 + -0xa6fe)) / 0xff);
          pout[lVar12 * 4 + 1] = (BYTE)(((uint)pout[lVar12 * 4 + 1] * (uint)bVar3) / 0xff);
          pout[lVar12 * 4] = (BYTE)(((uint)pout[lVar12 * 4] * (uint)bVar2) / 0xff);
          pout[lVar12 * 4 + 3] = BVar1;
        }
        lVar12 = lVar12 + 1;
        pBVar9 = pBVar9 + step;
      } while (count != (int)lVar12);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}